

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool __thiscall
absl::debugging_internal::anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
          (RustSymbolParser *this,char uppercase_namespace,int disambiguator)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  Nullable<char_*> pcVar4;
  char in_SIL;
  RustSymbolParser *in_RDI;
  DecodeRustPunycodeOptions in_stack_00000010;
  char c;
  int i;
  DecodeRustPunycodeOptions options;
  int num_bytes;
  bool is_punycoded;
  int *in_stack_ffffffffffffff80;
  int disambiguator_00;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int local_64;
  bool local_1;
  
  bVar1 = Eat(in_RDI,'u');
  cVar2 = Peek(in_RDI);
  bVar3 = IsDigit(cVar2);
  if (bVar3) {
    bVar3 = ParseDecimalNumber((RustSymbolParser *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                               in_stack_ffffffffffffff80);
    if (bVar3) {
      Eat(in_RDI,'_');
      if (bVar1) {
        in_stack_ffffffffffffff80 = (int *)in_RDI->out_end_;
        pcVar4 = DecodeRustPunycode(in_stack_00000010);
        in_RDI->out_ = pcVar4;
        if (in_RDI->out_ == (char *)0x0) {
          return false;
        }
        in_RDI->pos_ = in_RDI->pos_;
      }
      if (in_SIL != '\0') {
        in_stack_ffffffffffffff8c = (int)in_SIL;
        if (in_stack_ffffffffffffff8c == 0x43) {
          bVar3 = Emit((RustSymbolParser *)CONCAT44(0x43,in_stack_ffffffffffffff88),
                       (char *)in_stack_ffffffffffffff80);
          if (!bVar3) {
            return false;
          }
        }
        else if (in_stack_ffffffffffffff8c == 0x53) {
          bVar3 = Emit((RustSymbolParser *)CONCAT44(0x53,in_stack_ffffffffffffff88),
                       (char *)in_stack_ffffffffffffff80);
          if (!bVar3) {
            return false;
          }
        }
        else {
          bVar3 = EmitChar(in_RDI,'{');
          if ((!bVar3) || (bVar3 = EmitChar(in_RDI,in_SIL), !bVar3)) {
            return false;
          }
        }
      }
      disambiguator_00 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      if (!bVar1) {
        for (local_64 = 0; disambiguator_00 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
            local_64 < 0; local_64 = local_64 + 1) {
          cVar2 = Take(in_RDI);
          bVar1 = IsIdentifierChar('\0');
          if ((!bVar1) && (((int)cVar2 & 0x80U) == 0)) {
            return false;
          }
          bVar1 = EmitChar(in_RDI,cVar2);
          if (!bVar1) {
            return false;
          }
        }
      }
      if (in_SIL != '\0') {
        bVar1 = EmitChar(in_RDI,'#');
        if (!bVar1) {
          return false;
        }
        bVar1 = EmitDisambiguator((RustSymbolParser *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                  disambiguator_00);
        if (!bVar1) {
          return false;
        }
        bVar1 = EmitChar(in_RDI,'}');
        if (!bVar1) {
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseUndisambiguatedIdentifier(
      char uppercase_namespace = '\0', int disambiguator = 0) {
    // undisambiguated-identifier -> u? decimal-number _? bytes
    const bool is_punycoded = Eat('u');
    if (!IsDigit(Peek())) return false;
    int num_bytes = 0;
    if (!ParseDecimalNumber(num_bytes)) return false;
    (void)Eat('_');  // optional separator, needed if a digit follows
    if (is_punycoded) {
      DecodeRustPunycodeOptions options;
      options.punycode_begin = &encoding_[pos_];
      options.punycode_end = &encoding_[pos_] + num_bytes;
      options.out_begin = out_;
      options.out_end = out_end_;
      out_ = DecodeRustPunycode(options);
      if (out_ == nullptr) return false;
      pos_ += static_cast<size_t>(num_bytes);
    }

    // Emit the beginnings of braced forms like {shim:vtable#0}.
    if (uppercase_namespace != '\0') {
      switch (uppercase_namespace) {
        case 'C':
          if (!Emit("{closure")) return false;
          break;
        case 'S':
          if (!Emit("{shim")) return false;
          break;
        default:
          if (!EmitChar('{') || !EmitChar(uppercase_namespace)) return false;
          break;
      }
      if (num_bytes > 0 && !Emit(":")) return false;
    }

    // Emit the name itself.
    if (!is_punycoded) {
      for (int i = 0; i < num_bytes; ++i) {
        const char c = Take();
        if (!IsIdentifierChar(c) &&
            // The spec gives toolchains the choice of Punycode or raw UTF-8 for
            // identifiers containing code points above 0x7f, so accept bytes
            // with the high bit set.
            (c & 0x80) == 0) {
          return false;
        }
        if (!EmitChar(c)) return false;
      }
    }

    // Emit the endings of braced forms, e.g., "#42}".
    if (uppercase_namespace != '\0') {
      if (!EmitChar('#')) return false;
      if (!EmitDisambiguator(disambiguator)) return false;
      if (!EmitChar('}')) return false;
    }

    return true;
  }